

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

bool __thiscall
miniros::MasterLink::getParamImpl<float>
          (MasterLink *this,string *key,vector<float,_std::allocator<float>_> *vec,bool cached)

{
  bool bVar1;
  int iVar2;
  Type *pTVar3;
  XmlRpcValue *this_00;
  reference pvVar4;
  byte in_CL;
  vector<float,_std::allocator<float>_> *in_RDX;
  int i;
  RpcValue xml_array;
  undefined1 in_stack_00000427;
  RpcValue *in_stack_00000428;
  string *in_stack_00000430;
  MasterLink *in_stack_00000438;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  XmlRpcValue *in_stack_ffffffffffffff60;
  vector<float,_std::allocator<float>_> *__new_size;
  undefined4 in_stack_ffffffffffffff80;
  XmlRpcValue *in_stack_ffffffffffffffa8;
  int local_4c;
  XmlRpcValue local_38;
  byte local_21;
  vector<float,_std::allocator<float>_> *local_20;
  byte local_1;
  
  local_21 = in_CL & 1;
  local_20 = in_RDX;
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_38);
  bVar1 = getParamImpl(in_stack_00000438,in_stack_00000430,in_stack_00000428,(bool)in_stack_00000427
                      );
  if (bVar1) {
    pTVar3 = XmlRpc::XmlRpcValue::getType(&local_38);
    if (*pTVar3 == TypeArray) {
      __new_size = local_20;
      iVar2 = XmlRpc::XmlRpcValue::size(in_stack_ffffffffffffffa8);
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)CONCAT44(iVar2,in_stack_ffffffffffffff80),
                 (size_type)__new_size);
      local_4c = 0;
      while( true ) {
        iVar2 = XmlRpc::XmlRpcValue::size(in_stack_ffffffffffffffa8);
        if (iVar2 <= local_4c) break;
        this_00 = XmlRpc::XmlRpcValue::operator[]
                            (in_stack_ffffffffffffff60,(int)in_stack_ffffffffffffff5c);
        pTVar3 = XmlRpc::XmlRpcValue::getType(this_00);
        bVar1 = xml_castable<float>(*pTVar3);
        if (!bVar1) {
          local_1 = 0;
          goto LAB_00460e8b;
        }
        in_stack_ffffffffffffff60 =
             XmlRpc::XmlRpcValue::operator[]
                       (in_stack_ffffffffffffff60,(int)in_stack_ffffffffffffff5c);
        XmlRpc::XmlRpcValue::XmlRpcValue
                  (in_stack_ffffffffffffff60,
                   (XmlRpcValue *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        in_stack_ffffffffffffff5c = xml_cast<float>(this_00);
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](local_20,(long)local_4c);
        *pvVar4 = in_stack_ffffffffffffff5c;
        XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x460e51);
        local_4c = local_4c + 1;
      }
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
LAB_00460e8b:
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x460e95);
  return (bool)(local_1 & 1);
}

Assistant:

bool MasterLink::getParamImpl(const std::string& key, std::vector<T>& vec, bool cached)
{
  RpcValue xml_array;
  if (!getParamImpl(key, xml_array, cached)) {
    return false;
  }

  // Make sure it's an array type
  if (xml_array.getType() != RpcValue::TypeArray) {
    return false;
  }

  // Resize the target vector (destructive)
  vec.resize(xml_array.size());

  // Fill the vector with stuff
  for (int i = 0; i < xml_array.size(); i++) {
    if (!xml_castable<T>(xml_array[i].getType())) {
      return false;
    }

    vec[i] = xml_cast<T>(xml_array[i]);
  }

  return true;
}